

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::CFIReaderImpl::parseNonIdentifyingStringOrIndex3
          (CFIReaderImpl *this,
          vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
          *valueTable)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  size_t sVar4;
  DeadlyImportError *this_00;
  vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
  *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<const_Assimp::FIValue> *result;
  shared_ptr<const_Assimp::FIValue> sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  peVar3 = (((valueTable->
             super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage)->
           super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (((ulong)peVar3 & 0x20) == 0) {
    sVar6 = parseEncodedCharacterString5(this);
    _Var5 = sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
    if (((ulong)peVar3 & 0x10) != 0) {
      std::
      vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
      ::push_back(in_RDX,(value_type *)this);
      _Var5._M_pi = extraout_RDX;
    }
  }
  else {
    sVar4 = parseInt4((CFIReaderImpl *)valueTable);
    psVar1 = (in_RDX->
             super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(in_RDX->
                      super__Vector_base<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= sVar4) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(this_00,(string *)&parseErrorMessage_abi_cxx11_);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  psVar1[sVar4].
                  super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_FIReader).super_IIrrXMLReader<char,_irr::io::IXMLBase>._vptr_IIrrXMLReader =
         (_func_int **)_Var5._M_pi;
    p_Var2 = psVar1[sVar4].super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->data)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar6.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const FIValue> parseNonIdentifyingStringOrIndex3(std::vector<std::shared_ptr<const FIValue>> &valueTable) { // C.15
        uint8_t b = *dataP;
        if (b & 0x20) { // C.15.4
            // We have an index
            size_t index = parseInt4();
            if (index >= valueTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return valueTable[index];
        }
        else { // C.15.3
            // We have a literal
            std::shared_ptr<const FIValue> result = parseEncodedCharacterString5();
            if (b & 0x10) { // C.15.3.1
                valueTable.push_back(result);
            }
            return result;
        }
    }